

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

StringRef * __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getLeftSubString
          (StringRef *__return_storage_ptr__,
          StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,size_t length)

{
  if (length < this->m_length) {
    StringRefBase(__return_storage_ptr__,this->m_hdr,this->m_p,length,false);
  }
  else {
    StringRefBase(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

StringRef
	getLeftSubString(size_t length) const {
		if (length >= m_length)
			return *this;

		return StringRef(m_hdr, m_p, length);
	}